

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O3

bool __thiscall
duckdb::DictionaryDecoder::DictionarySupportsFilter
          (DictionaryDecoder *this,TableFilter *filter,TableFilterState *filter_state)

{
  bool bVar1;
  ConjunctionOrFilter *pCVar2;
  ConjunctionAndFilter *pCVar3;
  const_reference pvVar4;
  type pTVar5;
  reference pvVar6;
  type pTVar7;
  ExpressionFilter *this_00;
  size_type sVar8;
  LogicalType LStack_88;
  Value local_70;
  
  bVar1 = true;
  switch(filter->filter_type) {
  case CONSTANT_COMPARISON:
  case IS_NOT_NULL:
    break;
  default:
    bVar1 = false;
    break;
  case CONJUNCTION_OR:
    pCVar2 = TableFilter::Cast<duckdb::ConjunctionOrFilter>(filter);
    if ((pCVar2->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pCVar2->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sVar8 = 0;
      do {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                 ::operator[](&(pCVar2->super_ConjunctionFilter).child_filters,sVar8);
        pTVar5 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(pvVar4);
        pvVar6 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                               *)(filter_state + 1),sVar8);
        pTVar7 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                 ::operator*(pvVar6);
        bVar1 = DictionarySupportsFilter(this,pTVar5,pTVar7);
        if (!bVar1) {
          return bVar1;
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 < (ulong)((long)(pCVar2->super_ConjunctionFilter).child_filters.
                                     super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar2->super_ConjunctionFilter).child_filters.
                                     super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    break;
  case CONJUNCTION_AND:
    pCVar3 = TableFilter::Cast<duckdb::ConjunctionAndFilter>(filter);
    if ((pCVar3->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pCVar3->super_ConjunctionFilter).child_filters.
        super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sVar8 = 0;
      do {
        pvVar4 = vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_true>
                 ::operator[](&(pCVar3->super_ConjunctionFilter).child_filters,sVar8);
        pTVar5 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator*(pvVar4);
        pvVar6 = vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                 ::operator[]((vector<duckdb::unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>,_true>
                               *)(filter_state + 1),sVar8);
        pTVar7 = unique_ptr<duckdb::TableFilterState,_std::default_delete<duckdb::TableFilterState>,_true>
                 ::operator*(pvVar6);
        bVar1 = DictionarySupportsFilter(this,pTVar5,pTVar7);
        if (!bVar1) {
          return bVar1;
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 < (ulong)((long)(pCVar3->super_ConjunctionFilter).child_filters.
                                     super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pCVar3->super_ConjunctionFilter).child_filters.
                                     super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     .
                                     super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    break;
  case EXPRESSION_FILTER:
    this_00 = TableFilter::Cast<duckdb::ExpressionFilter>(filter);
    LogicalType::LogicalType(&LStack_88,&this->reader->column_schema->type);
    Value::Value(&local_70,&LStack_88);
    bVar1 = ExpressionFilter::EvaluateWithConstant
                      (this_00,(ExpressionExecutor *)(filter_state + 1),&local_70);
    Value::~Value(&local_70);
    LogicalType::~LogicalType(&LStack_88);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool DictionaryDecoder::DictionarySupportsFilter(const TableFilter &filter, TableFilterState &filter_state) {
	switch (filter.filter_type) {
	case TableFilterType::CONJUNCTION_OR: {
		auto &conjunction = filter.Cast<ConjunctionOrFilter>();
		auto &state = filter_state.Cast<ConjunctionOrFilterState>();
		for (idx_t child_idx = 0; child_idx < conjunction.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction.child_filters[child_idx];
			auto &child_state = *state.child_states[child_idx];
			if (!DictionarySupportsFilter(child_filter, child_state)) {
				return false;
			}
		}
		return true;
	}
	case TableFilterType::CONJUNCTION_AND: {
		auto &conjunction = filter.Cast<ConjunctionAndFilter>();
		auto &state = filter_state.Cast<ConjunctionAndFilterState>();
		for (idx_t child_idx = 0; child_idx < conjunction.child_filters.size(); child_idx++) {
			auto &child_filter = *conjunction.child_filters[child_idx];
			auto &child_state = *state.child_states[child_idx];
			if (!DictionarySupportsFilter(child_filter, child_state)) {
				return false;
			}
		}
		return true;
	}
	case TableFilterType::CONSTANT_COMPARISON:
	case TableFilterType::IS_NOT_NULL:
		return true;
	case TableFilterType::EXPRESSION_FILTER: {
		// expression filters can only be pushed into the dictionary if they filter out NULL values
		auto &expr_filter = filter.Cast<ExpressionFilter>();
		auto &state = filter_state.Cast<ExpressionFilterState>();
		auto emits_nulls = expr_filter.EvaluateWithConstant(state.executor, Value(reader.Type()));
		return !emits_nulls;
	}
	case TableFilterType::IS_NULL:
	case TableFilterType::DYNAMIC_FILTER:
	case TableFilterType::OPTIONAL_FILTER:
	case TableFilterType::STRUCT_EXTRACT:
	default:
		return false;
	}
}